

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_test.c
# Opt level: O2

bool_t wordTest(void)

{
  bool_t bVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  
  sVar2 = u64Weight(0);
  uVar4 = 0;
  if (sVar2 == 0) {
    uVar3 = 0;
    bVar1 = u64Parity(0);
    uVar4 = 0;
    if (bVar1 == 0) {
      bVar1 = u64Parity(1);
      if (bVar1 != 0) {
        sVar2 = u64Weight(0xa001);
        uVar4 = uVar3;
        if (sVar2 == 3) {
          bVar1 = u64Parity(0xa001);
          if (bVar1 != 0) {
            sVar2 = u64Weight(0xffff);
            if (sVar2 == 0x10) {
              bVar1 = u64Parity(0xffff);
              if (bVar1 == 0) {
                sVar2 = u64Weight(0xf000a001);
                if (sVar2 == 7) {
                  bVar1 = u64Parity(0xf000a001);
                  if (bVar1 != 0) {
                    sVar2 = u64Weight(0xe00a001);
                    if (sVar2 == 6) {
                      bVar1 = u64Parity(0xe00a001);
                      if (bVar1 == 0) {
                        sVar2 = u64Weight(0xffffffff);
                        if (sVar2 == 0x20) {
                          bVar1 = u64Parity(0xffffffff);
                          if (bVar1 == 0) {
                            sVar2 = u64Weight(0xaa0180eef000a001);
                            if (sVar2 == 0x13) {
                              bVar1 = u64Parity(0xaa0180eef000a001);
                              if (bVar1 != 0) {
                                sVar2 = u64Weight(0x730085060e00a001);
                                if (sVar2 == 0x10) {
                                  bVar1 = u64Parity(0x730085060e00a001);
                                  if (bVar1 == 0) {
                                    sVar2 = u64Weight(0xffffffffffffffff);
                                    if (sVar2 == 0x40) {
                                      bVar1 = u64Parity(0xffffffffffffffff);
                                      if (bVar1 == 0) {
                                        uVar4 = 0;
                                        sVar2 = u64CTZ(0);
                                        if (sVar2 == 0x40) {
                                          uVar4 = 0;
                                          sVar2 = u64CTZ_fast(0);
                                          if (sVar2 == 0x40) {
                                            uVar4 = 0;
                                            sVar2 = u64CLZ(0);
                                            if (sVar2 == 0x40) {
                                              uVar4 = 0;
                                              sVar2 = u64CLZ_fast(0);
                                              if (sVar2 == 0x40) {
                                                sVar2 = u64CTZ(1);
                                                if (sVar2 == 0) {
                                                  sVar2 = u64CTZ_fast(1);
                                                  if (sVar2 == 0) {
                                                    sVar2 = u64CLZ(1);
                                                    if (sVar2 == 0x3f) {
                                                      sVar2 = u64CLZ_fast(1);
                                                      if (sVar2 == 0x3f) {
                                                        sVar2 = u64CTZ(0xfff8);
                                                        if (sVar2 == 3) {
                                                          sVar2 = u64CTZ_fast(0xfff8);
                                                          if (sVar2 == 3) {
                                                            sVar2 = u64CLZ(0xfff8);
                                                            if (sVar2 == 0x30) {
                                                              sVar2 = u64CLZ_fast(0xfff8);
                                                              if (sVar2 == 0x30) {
                                                                sVar2 = u64CTZ(0x7fffe000);
                                                                if (sVar2 == 0xd) {
                                                                  sVar2 = u64CTZ_fast(0x7fffe000);
                                                                  if (sVar2 == 0xd) {
                                                                    sVar2 = u64CLZ(0x7fffe000);
                                                                    if (sVar2 == 0x21) {
                                                                      sVar2 = u64CLZ_fast(0x7fffe000
                                                                                         );
                                                                      if (sVar2 == 0x21) {
                                                                        sVar2 = u64CTZ(0x3ffddf8000)
                                                                        ;
                                                                        if (sVar2 == 0xf) {
                                                                          sVar2 = u64CTZ_fast(
                                                  0x3ffddf8000);
                                                  if (sVar2 == 0xf) {
                                                    sVar2 = u64CLZ(0x3ffddf8000);
                                                    if (sVar2 == 0x1a) {
                                                      sVar2 = u64CLZ_fast(0x3ffddf8000);
                                                      uVar4 = (uint)(sVar2 == 0x1a);
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar4;
}

Assistant:

bool_t wordTest()
{
	// weight / parity
	if (wordWeight(0) != 0 ||
		wordParity(0) ||
		!wordParity(1) ||
		wordWeight(0xA001) != 3 ||
		!wordParity(0xA001) ||
		wordWeight(0xFFFF) != 16 ||
		wordParity(0xFFFF) 
#if (B_PER_W >= 32)
		||
		wordWeight(0xF000A001) != 7 ||
		!wordParity(0xF000A001) ||
		wordWeight(0x0E00A001) != 6 ||
		wordParity(0x0E00A001) ||
		wordWeight(0xFFFFFFFF) != 32 ||
		wordParity(0xFFFFFFFF)
#endif
#if (B_PER_W == 64)
		||
		wordWeight(0xAA0180EEF000A001) != 19 ||
		!wordParity(0xAA0180EEF000A001) ||
		wordWeight(0x730085060E00A001) != 16 ||
		wordParity(0x730085060E00A001) ||
		wordWeight(0xFFFFFFFFFFFFFFFF) != 64 ||
		wordParity(0xFFFFFFFFFFFFFFFF)
#endif
	)
		return FALSE;
	// CTZ / CLZ
	if (wordCTZ(0) != B_PER_W ||
		FAST(wordCTZ)(0) != B_PER_W ||
		wordCLZ(0) != B_PER_W ||
		FAST(wordCLZ)(0) != B_PER_W ||
		wordCTZ(1) != 0 ||
		FAST(wordCTZ)(1) != 0 ||
		wordCLZ(1) != B_PER_W - 1 ||
		FAST(wordCLZ)(1) != B_PER_W - 1 ||
		wordCTZ(0xFFF8) != 3 ||
		FAST(wordCTZ)(0xFFF8) != 3 ||
		wordCLZ(0xFFF8) != B_PER_W - 16 ||
		FAST(wordCLZ)(0xFFF8) != B_PER_W - 16 
#if (B_PER_W >= 32)
		||
		wordCTZ(0x7FFFE000) != 13 ||
		FAST(wordCTZ)(0x7FFFE000) != 13 ||
		wordCLZ(0x7FFFE000) != B_PER_W - 31 ||
		FAST(wordCLZ)(0x7FFFE000) != B_PER_W - 31
#endif
#if (B_PER_W == 64)
		||
		wordCTZ(0x0000003FFDDF8000) != 15 ||
		FAST(wordCTZ)(0x0000003FFDDF8000) != 15 ||
		wordCLZ(0x0000003FFDDF8000) != 26 ||
		FAST(wordCLZ)(0x0000003FFDDF8000) != 26
#endif
		)
		return FALSE;
	// все нормально
	return TRUE;
}